

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboTestUtil.cpp
# Opt level: O0

Vector<int,_4> __thiscall
deqp::gles3::Functional::FboTestUtil::castVectorSaturate<int>(FboTestUtil *this,Vec4 *in)

{
  int iVar1;
  undefined8 extraout_RDX;
  float fVar2;
  Vector<int,_4> VVar3;
  undefined4 local_78;
  undefined4 local_70;
  undefined4 local_64;
  undefined4 local_5c;
  undefined4 local_50;
  undefined4 local_48;
  undefined4 local_3c;
  undefined4 local_34;
  Vec4 *in_local;
  
  fVar2 = tcu::Vector<float,_4>::x(in);
  iVar1 = std::numeric_limits<int>::max();
  if (fVar2 + 0.5 < (float)iVar1) {
    fVar2 = tcu::Vector<float,_4>::x(in);
    iVar1 = std::numeric_limits<int>::min();
    if ((float)iVar1 < fVar2 - 0.5) {
      fVar2 = tcu::Vector<float,_4>::x(in);
      local_3c = (int)fVar2;
    }
    else {
      local_3c = std::numeric_limits<int>::min();
    }
    local_34 = local_3c;
  }
  else {
    local_34 = std::numeric_limits<int>::max();
  }
  fVar2 = tcu::Vector<float,_4>::y(in);
  iVar1 = std::numeric_limits<int>::max();
  if (fVar2 + 0.5 < (float)iVar1) {
    fVar2 = tcu::Vector<float,_4>::y(in);
    iVar1 = std::numeric_limits<int>::min();
    if ((float)iVar1 < fVar2 - 0.5) {
      fVar2 = tcu::Vector<float,_4>::y(in);
      local_50 = (int)fVar2;
    }
    else {
      local_50 = std::numeric_limits<int>::min();
    }
    local_48 = local_50;
  }
  else {
    local_48 = std::numeric_limits<int>::max();
  }
  fVar2 = tcu::Vector<float,_4>::z(in);
  iVar1 = std::numeric_limits<int>::max();
  if (fVar2 + 0.5 < (float)iVar1) {
    fVar2 = tcu::Vector<float,_4>::z(in);
    iVar1 = std::numeric_limits<int>::min();
    if ((float)iVar1 < fVar2 - 0.5) {
      fVar2 = tcu::Vector<float,_4>::z(in);
      local_64 = (int)fVar2;
    }
    else {
      local_64 = std::numeric_limits<int>::min();
    }
    local_5c = local_64;
  }
  else {
    local_5c = std::numeric_limits<int>::max();
  }
  fVar2 = tcu::Vector<float,_4>::w(in);
  iVar1 = std::numeric_limits<int>::max();
  if (fVar2 + 0.5 < (float)iVar1) {
    fVar2 = tcu::Vector<float,_4>::w(in);
    iVar1 = std::numeric_limits<int>::min();
    if ((float)iVar1 < fVar2 - 0.5) {
      fVar2 = tcu::Vector<float,_4>::w(in);
      local_78 = (int)fVar2;
    }
    else {
      local_78 = std::numeric_limits<int>::min();
    }
    local_70 = local_78;
  }
  else {
    local_70 = std::numeric_limits<int>::max();
  }
  tcu::Vector<int,_4>::Vector((Vector<int,_4> *)this,local_34,local_48,local_5c,local_70);
  VVar3.m_data[2] = (int)extraout_RDX;
  VVar3.m_data[3] = (int)((ulong)extraout_RDX >> 0x20);
  VVar3.m_data._0_8_ = this;
  return (Vector<int,_4>)VVar3.m_data;
}

Assistant:

static tcu::Vector<T, 4> castVectorSaturate (const tcu::Vec4& in)
{
	return tcu::Vector<T, 4>((in.x() + 0.5f >= std::numeric_limits<T>::max()) ? (std::numeric_limits<T>::max()) : ((in.x() - 0.5f <= std::numeric_limits<T>::min()) ? (std::numeric_limits<T>::min()) : (T(in.x()))),
	                         (in.y() + 0.5f >= std::numeric_limits<T>::max()) ? (std::numeric_limits<T>::max()) : ((in.y() - 0.5f <= std::numeric_limits<T>::min()) ? (std::numeric_limits<T>::min()) : (T(in.y()))),
							 (in.z() + 0.5f >= std::numeric_limits<T>::max()) ? (std::numeric_limits<T>::max()) : ((in.z() - 0.5f <= std::numeric_limits<T>::min()) ? (std::numeric_limits<T>::min()) : (T(in.z()))),
							 (in.w() + 0.5f >= std::numeric_limits<T>::max()) ? (std::numeric_limits<T>::max()) : ((in.w() - 0.5f <= std::numeric_limits<T>::min()) ? (std::numeric_limits<T>::min()) : (T(in.w()))));
}